

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

Delay3Syntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::Delay3Syntax,slang::parsing::Token&,slang::parsing::Token&,slang::syntax::ExpressionSyntax&,slang::parsing::Token&,slang::syntax::ExpressionSyntax*&,slang::parsing::Token&,slang::syntax::ExpressionSyntax*&,slang::parsing::Token&>
          (BumpAllocator *this,Token *args,Token *args_1,ExpressionSyntax *args_2,Token *args_3,
          ExpressionSyntax **args_4,Token *args_5,ExpressionSyntax **args_6,Token *args_7)

{
  Token hash;
  Token comma1;
  Token closeParen;
  Delay3Syntax *pDVar1;
  undefined8 *in_RDX;
  undefined8 *in_RSI;
  Token *in_R8;
  undefined8 *in_stack_00000008;
  undefined8 *in_stack_00000010;
  Token *in_stack_00000018;
  size_t in_stack_ffffffffffffff28;
  size_t in_stack_ffffffffffffff30;
  BumpAllocator *in_stack_ffffffffffffff38;
  undefined8 in_stack_ffffffffffffff58;
  
  pDVar1 = (Delay3Syntax *)
           allocate(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  hash.info = (Info *)pDVar1;
  hash.kind = (short)in_stack_ffffffffffffff58;
  hash._2_1_ = (char)((ulong)in_stack_ffffffffffffff58 >> 0x10);
  hash.numFlags.raw = (char)((ulong)in_stack_ffffffffffffff58 >> 0x18);
  hash.rawLen = (int)((ulong)in_stack_ffffffffffffff58 >> 0x20);
  comma1.info = (Info *)*in_stack_00000008;
  comma1._0_8_ = in_stack_00000018->info;
  closeParen.info = (Info *)*in_RSI;
  closeParen._0_8_ = in_RDX[1];
  slang::syntax::Delay3Syntax::Delay3Syntax
            ((Delay3Syntax *)*in_stack_00000010,hash,*in_stack_00000018,
             (ExpressionSyntax *)in_stack_00000008[1],comma1,
             (ExpressionSyntax *)in_stack_00000008[1],*in_R8,(ExpressionSyntax *)*in_RDX,closeParen)
  ;
  return pDVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }